

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void GPU_FreeRenderer(GPU_Renderer *renderer)

{
  long lVar1;
  GPU_Renderer **ppGVar2;
  GPU_RendererID id;
  GPU_Renderer *pGVar3;
  long lVar4;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  if (renderer != (GPU_Renderer *)0x0) {
    pGVar3 = GPU_GetCurrentRenderer();
    if (pGVar3 == renderer) {
      GPU_MakeRendererID((GPU_RendererID *)&stack0xffffffffffffffd0,"Unknown",0,0,0);
      id.renderer = (GPU_RendererEnum)in_stack_ffffffffffffffd8;
      id.major_version = SUB84(in_stack_ffffffffffffffd8,4);
      id.name = in_stack_ffffffffffffffd0;
      id.minor_version = (int)in_stack_ffffffffffffffe0;
      id._20_4_ = SUB84(in_stack_ffffffffffffffe0,4);
      GPU_SetCurrentRenderer(id);
    }
    lVar4 = 0;
    do {
      if (lVar4 == 0x14) {
        return;
      }
      lVar1 = lVar4 + 1;
      ppGVar2 = _gpu_renderer_map + lVar4;
      lVar4 = lVar1;
    } while (*ppGVar2 != renderer);
    gpu_free_renderer_memory(renderer);
    *(undefined8 *)(&_gpu_initialized_SDL + lVar1 * 8) = 0;
  }
  return;
}

Assistant:

void GPU_FreeRenderer(GPU_Renderer* renderer)
{
	int i;
	GPU_Renderer* current_renderer;
	
	if(renderer == NULL)
        return;
	
    current_renderer = GPU_GetCurrentRenderer();
    if(current_renderer == renderer)
        GPU_SetCurrentRenderer(GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0));
        
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(renderer == _gpu_renderer_map[i])
		{
			gpu_free_renderer_memory(renderer);
			_gpu_renderer_map[i] = NULL;
			return;
		}
	}
}